

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

int tryconnect(_glist *x,t_object *src,int nout,t_object *sink,int nin)

{
  t_object *x_00;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  _glist *p_Var7;
  void *data;
  int local_148;
  int local_140;
  char **local_138;
  char *tags [2];
  char tag [128];
  int ly2;
  int lx2;
  int ly1;
  int lx1;
  int ninlets;
  int noutlets1;
  int y22;
  int y21;
  int y12;
  int y11;
  int x22;
  int x21;
  int x12;
  int x11;
  int iom;
  int iow;
  _outconnect *oc;
  t_object *ptStack_50;
  int nin_local;
  t_object *sink_local;
  t_object *ptStack_40;
  int nout_local;
  t_object *src_local;
  _glist *x_local;
  
  oc._4_4_ = nin;
  ptStack_50 = sink;
  sink_local._4_4_ = nout;
  ptStack_40 = src;
  src_local = &x->gl_obj;
  iVar1 = canconnect(x,src,nout,sink,nin);
  if ((iVar1 == 0) ||
     (_iom = obj_connect(ptStack_40,sink_local._4_4_,ptStack_50,oc._4_4_),
     _iom == (_outconnect *)0x0)) {
    x_local._4_4_ = 0;
  }
  else {
    x11 = *(int *)&src_local[4].te_width * 7;
    x12 = *(int *)&src_local[4].te_width * 3;
    x21 = 0;
    x22 = 0;
    y11 = 0;
    y12 = 0;
    y21 = 0;
    y22 = 0;
    noutlets1 = 0;
    ninlets = 0;
    local_138 = tags + 1;
    tags[0] = "cord";
    sprintf((char *)(tags + 1),"l%lx",_iom);
    gobj_getrect(&ptStack_40->te_g,(_glist *)src_local,&x21,&y21,&x22,&y22);
    gobj_getrect(&ptStack_50->te_g,(_glist *)src_local,&y11,&noutlets1,&y12,&ninlets);
    iVar2 = obj_noutlets(ptStack_40);
    iVar3 = obj_ninlets(ptStack_50);
    iVar6 = y22;
    iVar1 = noutlets1;
    if (iVar2 < 2) {
      local_140 = 0;
    }
    else {
      local_140 = (((x22 - x21) - x11) * sink_local._4_4_) / (iVar2 + -1);
    }
    uVar4 = x21 + local_140 + x12;
    if (iVar3 < 2) {
      local_148 = 0;
    }
    else {
      local_148 = (((y12 - y11) - x11) * oc._4_4_) / (iVar3 + -1);
    }
    iVar3 = y11 + local_148 + x12;
    p_Var7 = glist_getcanvas((_glist *)src_local);
    iVar5 = obj_issignaloutlet(ptStack_40,sink_local._4_4_);
    iVar2 = 1;
    if (iVar5 != 0) {
      iVar2 = 2;
    }
    pdgui_vmess((char *)0x0,"crr iiii ri rS",p_Var7,"create","line",(ulong)uVar4,iVar6,iVar3,iVar1,
                "-width",iVar2 * *(int *)&src_local[4].te_width,"-tags",2,&local_138);
    x_00 = src_local;
    iVar6 = canvas_getindex((_glist *)src_local,&ptStack_40->te_g);
    iVar1 = sink_local._4_4_;
    iVar2 = canvas_getindex((_glist *)src_local,&ptStack_50->te_g);
    data = canvas_undo_set_connect((_glist *)x_00,iVar6,iVar1,iVar2,oc._4_4_);
    canvas_undo_add((_glist *)x_00,UNDO_CONNECT,"connect",data);
    canvas_dirty((_glist *)src_local,1.0);
    x_local._4_4_ = 1;
  }
  return x_local._4_4_;
}

Assistant:

static int tryconnect(t_canvas*x, t_object*src, int nout, t_object*sink, int nin)
{
    if(canconnect(x, src, nout, sink, nin))
    {
        t_outconnect *oc = obj_connect(src, nout, sink, nin);
        if(oc)
        {
            int iow = IOWIDTH * x->gl_zoom;
            int iom = IOMIDDLE * x->gl_zoom;
            int x11=0, x12=0, x21=0, x22=0;
            int y11=0, y12=0, y21=0, y22=0;
            int noutlets1, ninlets, lx1, ly1, lx2, ly2;
            char tag[128];
            char*tags[] = {tag, "cord"};
            sprintf(tag, "l%lx", oc);
            gobj_getrect(&src->ob_g, x, &x11, &y11, &x12, &y12);
            gobj_getrect(&sink->ob_g, x, &x21, &y21, &x22, &y22);

            noutlets1 = obj_noutlets(src);
            ninlets = obj_ninlets(sink);

            lx1 = x11 + (noutlets1 > 1 ?
                             ((x12-x11-iow) * nout)/(noutlets1-1) : 0)
                + iom;
            ly1 = y12;
            lx2 = x21 + (ninlets > 1 ?
                             ((x22-x21-iow) * nin)/(ninlets-1) : 0)
                + iom;
            ly2 = y21;
            pdgui_vmess(0, "crr iiii ri rS",
                glist_getcanvas(x), "create", "line",
                lx1,ly1, lx2,ly2,
                "-width", (obj_issignaloutlet(src, nout) ? 2 : 1) * x->gl_zoom,
                "-tags", 2, tags);
            canvas_undo_add(x, UNDO_CONNECT, "connect", canvas_undo_set_connect(x,
                    canvas_getindex(x, &src->ob_g), nout,
                    canvas_getindex(x, &sink->ob_g), nin));
            canvas_dirty(x, 1);
            return 1;
        }
    }
    return 0;
}